

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::paintEvent(QPlainTextEdit *this,QPaintEvent *e)

{
  QPlainTextEditPrivate *this_00;
  Selection *pSVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  TextInteractionFlags TVar9;
  QWidget *pQVar10;
  long *plVar11;
  QBrush *pQVar12;
  QPainter *pQVar13;
  QScrollBar *pQVar14;
  QPalette *pQVar15;
  int iVar16;
  long lVar17;
  QPaintDevice *pQVar18;
  undefined8 *puVar19;
  PaintContext *pPVar20;
  int i;
  ulong uVar21;
  QTextFormat *pQVar22;
  long in_FS_OFFSET;
  byte bVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  double dVar26;
  Data *pDVar27;
  FormatRange *pFVar28;
  double dVar29;
  QRect QVar31;
  long local_128;
  QBrush bg;
  undefined8 local_118;
  undefined8 uStack_110;
  QPointF local_108;
  QPainter painter;
  QArrayDataPointer<QTextLayout::FormatRange> local_e8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 local_b8 [8];
  FormatRange *pFStack_b0;
  undefined1 *local_a8;
  double local_a0;
  PaintContext context;
  undefined1 local_48 [8];
  QTextCharFormat QStack_40;
  undefined1 *puVar30;
  
  bVar23 = 0;
  QStack_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  _painter = &DAT_aaaaaaaaaaaaaaaa;
  pQVar10 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  pQVar18 = &pQVar10->super_QPaintDevice;
  if (pQVar10 == (QWidget *)0x0) {
    pQVar18 = (QPaintDevice *)0x0;
  }
  QPainter::QPainter(&painter,pQVar18);
  local_108 = contentOffset(this);
  local_118 = *(undefined8 *)(e + 0x10);
  uStack_110 = *(FormatRange **)(e + 0x18);
  pQVar10 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  QVar31 = QWidget::rect(pQVar10);
  bVar2 = isReadOnly(this);
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QStack_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  firstVisibleBlock((QPlainTextEdit *)local_48);
  document(this);
  plVar11 = (long *)QTextDocument::documentLayout();
  puVar24 = (undefined1 *)(**(code **)(*plVar11 + 0x78))(plVar11);
  QPainter::setBrushOrigin((QPointF *)&painter);
  puVar25 = (undefined1 *)(double)((QVar31.x2.m_i.m_i - QVar31.x1.m_i) + 1);
  puVar30 = puVar24;
  if ((double)puVar24 <= (double)puVar25) {
    puVar30 = puVar25;
  }
  dVar29 = (double)puVar30 + local_108.xp;
  document(this);
  dVar26 = (double)QTextDocument::documentMargin();
  iVar5 = cursorWidth(this);
  iVar5 = (int)((double)iVar5 + (dVar29 - dVar26));
  if ((int)uStack_110 < iVar5) {
    iVar5 = (int)uStack_110;
  }
  uStack_110 = (FormatRange *)CONCAT44(uStack_110._4_4_,iVar5);
  QPainter::setClipRect((QRect *)&painter,(ClipOperation)&local_118);
  bVar3 = QPlainTextEditPrivate::placeHolderTextToBeShown(this_00);
  if (bVar3) {
    QWidgetTextControl::palette((QWidgetTextControl *)&context);
    pQVar12 = QPalette::placeholderText((QPalette *)&context);
    local_e8.d = *(Data **)(*(long *)pQVar12 + 8);
    local_e8.ptr = *(FormatRange **)(*(long *)pQVar12 + 0x10);
    QPalette::~QPalette((QPalette *)&context);
    QPainter::setPen((QColor *)&painter);
    QPainter::setClipRect((QRect *)&painter,(int)e + 0x10);
    document(this);
    dVar26 = (double)QTextDocument::documentMargin();
    iVar16 = (int)dVar26 + QVar31.x1.m_i.m_i;
    context._0_8_ = (BADTYPE)iVar16;
    iVar5 = (int)dVar26 + QVar31.y1.m_i.m_i;
    context.palette.d = (QPalettePrivate *)(double)iVar5;
    context.palette._8_8_ = (BADTYPE)(((long)QVar31.x2.m_i.m_i - (long)iVar16) + 1);
    context.clip.xp = (qreal)(((QVar31._8_8_ >> 0x20) - (long)iVar5) + 1);
    placeholderText((QString *)local_b8,this);
    QPainter::drawText((QRectF *)&painter,(int)&context,(QString *)0x1020,(QRectF *)local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  }
  puVar19 = &DAT_006643d0;
  pPVar20 = &context;
  for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
    *(undefined8 *)pPVar20 = *puVar19;
    puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
    pPVar20 = (PaintContext *)((long)pPVar20 + (ulong)bVar23 * -0x10 + 8);
  }
  getPaintContext(&context,this);
  QPalette::text(&context.palette);
  QPainter::setPen((QColor *)&painter);
  while( true ) {
    cVar4 = QTextBlock::isValid();
    if (cVar4 == '\0') break;
    blockBoundingRect((QRectF *)local_b8,this,(QTextBlock *)local_48);
    dVar26 = local_a0;
    puVar30 = local_a8;
    pDVar27 = (Data *)((double)local_b8 + local_108.xp);
    pFVar28 = (FormatRange *)((double)pFStack_b0 + local_108.yp);
    pQVar13 = (QPainter *)QTextBlock::layout();
    cVar4 = QTextBlock::isVisible();
    if (cVar4 == '\0') {
      local_108.yp = dVar26 + local_108.yp;
    }
    else {
      if (((double)local_118._4_4_ <= (double)pFVar28 + dVar26) &&
         ((double)pFVar28 <= (double)uStack_110._4_4_)) {
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::blockFormat();
        _bg = &DAT_aaaaaaaaaaaaaaaa;
        QTextFormat::background((QTextFormat *)&bg);
        local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
        bVar3 = ::operator!=(&bg,(BrushStyle *)local_b8);
        if (bVar3) {
          local_a8 = puVar24;
          if ((double)puVar24 <= (double)puVar30) {
            local_a8 = puVar30;
          }
          local_b8 = (undefined1  [8])pDVar27;
          pFStack_b0 = pFVar28;
          local_a0 = dVar26;
          QBrush::QBrush((QBrush *)&local_128,&bg);
          QPainter::save();
          if (2 < *(int *)(local_128 + 4) - 0xfU) {
            local_e8.d = (Data *)local_b8;
            local_e8.ptr = pFStack_b0;
            QPainter::setBrushOrigin((QPointF *)&painter);
          }
          QPainter::fillRect((QRectF *)&painter,(QBrush *)local_b8);
          QPainter::restore();
          QBrush::~QBrush((QBrush *)&local_128);
        }
        local_e8.d = (Data *)0x0;
        local_e8.ptr = (FormatRange *)0x0;
        local_e8.size = 0;
        iVar5 = QTextBlock::position();
        iVar16 = QTextBlock::length();
        lVar17 = 0;
        for (uVar21 = 0; pSVar1 = context.selections.d.ptr,
            uVar21 < (ulong)context.selections.d.size; uVar21 = uVar21 + 1) {
          iVar6 = QTextCursor::selectionStart();
          iVar7 = QTextCursor::selectionEnd();
          if (((iVar6 < iVar7) && (iVar6 = iVar6 - iVar5, iVar6 < iVar16)) && (0 < iVar7 - iVar5)) {
            local_a8 = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            pFStack_b0 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
            QTextCharFormat::QTextCharFormat((QTextCharFormat *)&pFStack_b0);
            local_b8._4_4_ = (iVar7 - iVar5) - iVar6;
            local_b8._0_4_ = iVar6;
            QTextFormat::operator=
                      ((QTextFormat *)&pFStack_b0,&(pSVar1->format).super_QTextFormat + lVar17);
            QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                      ((QList<QTextLayout::FormatRange> *)&local_e8,(FormatRange *)local_b8);
LAB_0045ab32:
            QTextFormat::~QTextFormat((QTextFormat *)&pFStack_b0);
          }
          else {
            cVar4 = QTextCursor::hasSelection();
            if (cVar4 == '\0') {
              pQVar22 = &(pSVar1->format).super_QTextFormat + lVar17;
              cVar4 = QTextFormat::hasProperty((int)pQVar22);
              if (cVar4 != '\0') {
                QTextCursor::position();
                cVar4 = QTextBlock::contains((int)local_48);
                if (cVar4 != '\0') {
                  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                  pFStack_b0 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
                  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&pFStack_b0);
                  QTextCursor::position();
                  QTextLayout::lineForTextPosition((int)pQVar13);
                  uVar8 = QTextLine::textStart();
                  local_b8._0_4_ = uVar8;
                  iVar6 = QTextLine::textLength();
                  if (local_b8._0_4_ + iVar6 == iVar16 + -1) {
                    iVar6 = iVar6 + 1;
                  }
                  local_b8._4_4_ = iVar6;
                  QTextFormat::operator=((QTextFormat *)&pFStack_b0,pQVar22);
                  QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                            ((QList<QTextLayout::FormatRange> *)&local_e8,(FormatRange *)local_b8);
                  goto LAB_0045ab32;
                }
              }
            }
          }
          lVar17 = lVar17 + 0x18;
        }
        if (bVar2) {
          TVar9 = textInteractionFlags(this);
          bVar3 = true;
          if (((uint)TVar9.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                     super_QFlagsStorage<Qt::TextInteractionFlag>.i & 2) != 0) goto LAB_0045acb0;
        }
        else {
LAB_0045acb0:
          bVar3 = true;
          if (context.cursorPosition < iVar16 + iVar5 && iVar5 <= context.cursorPosition) {
            bVar3 = overwriteMode(this);
            if (bVar3) {
              bVar3 = context.cursorPosition != iVar16 + -1 + iVar5;
              if (bVar3) {
                local_a8 = &DAT_aaaaaaaaaaaaaaaa;
                local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                pFStack_b0 = (FormatRange *)&DAT_aaaaaaaaaaaaaaaa;
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)&pFStack_b0);
                local_b8._4_4_ = 1;
                local_b8._0_4_ = context.cursorPosition - iVar5;
                pQVar15 = QWidget::palette((QWidget *)this);
                pQVar12 = QPalette::base(pQVar15);
                QTextFormat::setForeground((QTextFormat *)&pFStack_b0,pQVar12);
                pQVar15 = QWidget::palette((QWidget *)this);
                pQVar12 = QPalette::text(pQVar15);
                QTextFormat::setBackground((QTextFormat *)&pFStack_b0,pQVar12);
                QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
                          ((QList<QTextLayout::FormatRange> *)&local_e8,(FormatRange *)local_b8);
                QTextFormat::~QTextFormat((QTextFormat *)&pFStack_b0);
              }
            }
            else {
              bVar3 = false;
            }
          }
        }
        local_b8 = (undefined1  [8])(double)(int)local_118;
        iVar16 = (int)((ulong)local_118 >> 0x20);
        pFStack_b0 = (FormatRange *)(double)iVar16;
        local_a8 = (undefined1 *)(double)(((long)(int)uStack_110 - (long)(int)local_118) + 1);
        local_a0 = (double)(((long)uStack_110._4_4_ - (long)iVar16) + 1);
        QTextLayout::draw(pQVar13,(QPointF *)&painter,(QList_conflict *)&local_108,
                          (QRectF *)&local_e8);
        if (bVar3) {
          if (context.cursorPosition < -1 && !bVar2) {
            QTextLayout::preeditAreaText();
            puVar30 = local_a8;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8)
            ;
            if (puVar30 != (undefined1 *)0x0) goto LAB_0045ae67;
          }
        }
        else {
LAB_0045ae67:
          iVar16 = context.cursorPosition;
          if (context.cursorPosition < -1) {
            iVar5 = QTextLayout::preeditAreaPosition();
            iVar5 = (iVar5 - iVar16) + -2;
          }
          else {
            iVar5 = context.cursorPosition - iVar5;
          }
          cursorWidth(this);
          QTextLayout::drawCursor(pQVar13,(QPointF *)&painter,(int)&local_108,iVar5);
        }
        QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_e8);
        QBrush::~QBrush(&bg);
        QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
      }
      dVar26 = dVar26 + local_108.yp;
      local_108.yp = dVar26;
      if ((double)((QVar31.y2.m_i.m_i - QVar31.y1.m_i) + 1) < dVar26) break;
    }
    QTextBlock::next();
    pFVar28 = pFStack_b0;
    local_48 = local_b8;
    QStack_40.super_QTextFormat = pFStack_b0._0_1_;
    QStack_40._1_3_ = pFStack_b0._1_3_;
    pFStack_b0 = pFVar28;
  }
  if (((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8 +
                 0x348) & 4) != 0) && (cVar4 = QTextBlock::isValid(), cVar4 == '\0')) {
    if (local_108.yp <= (double)uStack_110._4_4_) {
      if ((*(byte *)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                               field_0x8 + 0x348) & 8) == 0) {
        pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar5 = QAbstractSlider::maximum(&pQVar14->super_QAbstractSlider);
        pQVar14 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
        iVar16 = QAbstractSlider::minimum(&pQVar14->super_QAbstractSlider);
        if (iVar5 != iVar16) goto LAB_0045aff9;
      }
      local_b8 = (undefined1  [8])CONCAT44((int)local_108.yp,(int)local_118);
      pFStack_b0 = uStack_110;
      pQVar15 = QWidget::palette((QWidget *)this);
      QPalette::window(pQVar15);
      QPainter::fillRect((QRect *)&painter,(QBrush *)local_b8);
    }
  }
LAB_0045aff9:
  QAbstractTextDocumentLayout::PaintContext::~PaintContext(&context);
  QPainter::~QPainter(&painter);
  if (*(long *)(in_FS_OFFSET + 0x28) != QStack_40._8_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEdit::paintEvent(QPaintEvent *e)
{
    Q_D(QPlainTextEdit);
    QPainter painter(viewport());
    Q_ASSERT(qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout()));

    QPointF offset(contentOffset());

    QRect er = e->rect();
    QRect viewportRect = viewport()->rect();

    bool editable = !isReadOnly();

    QTextBlock block = firstVisibleBlock();
    qreal maximumWidth = document()->documentLayout()->documentSize().width();

    // Set a brush origin so that the WaveUnderline knows where the wave started
    painter.setBrushOrigin(offset);

    // keep right margin clean from full-width selection
    int maxX = offset.x() + qMax((qreal)viewportRect.width(), maximumWidth)
               - document()->documentMargin() + cursorWidth();
    er.setRight(qMin(er.right(), maxX));
    painter.setClipRect(er);

    if (d->placeHolderTextToBeShown()) {
        const QColor col = d->control->palette().placeholderText().color();
        painter.setPen(col);
        painter.setClipRect(e->rect());
        const int margin = int(document()->documentMargin());
        QRectF textRect = viewportRect.adjusted(margin, margin, 0, 0);
        painter.drawText(textRect, Qt::AlignTop | Qt::TextWordWrap, placeholderText());
    }

    QAbstractTextDocumentLayout::PaintContext context = getPaintContext();
    painter.setPen(context.palette.text().color());

    while (block.isValid()) {

        QRectF r = blockBoundingRect(block).translated(offset);
        QTextLayout *layout = block.layout();

        if (!block.isVisible()) {
            offset.ry() += r.height();
            block = block.next();
            continue;
        }

        if (r.bottom() >= er.top() && r.top() <= er.bottom()) {

            QTextBlockFormat blockFormat = block.blockFormat();

            QBrush bg = blockFormat.background();
            if (bg != Qt::NoBrush) {
                QRectF contentsRect = r;
                contentsRect.setWidth(qMax(r.width(), maximumWidth));
                fillBackground(&painter, contentsRect, bg);
            }

            QList<QTextLayout::FormatRange> selections;
            int blpos = block.position();
            int bllen = block.length();
            for (int i = 0; i < context.selections.size(); ++i) {
                const QAbstractTextDocumentLayout::Selection &range = context.selections.at(i);
                const int selStart = range.cursor.selectionStart() - blpos;
                const int selEnd = range.cursor.selectionEnd() - blpos;
                if (selStart < bllen && selEnd > 0
                    && selEnd > selStart) {
                    QTextLayout::FormatRange o;
                    o.start = selStart;
                    o.length = selEnd - selStart;
                    o.format = range.format;
                    selections.append(o);
                } else if (!range.cursor.hasSelection() && range.format.hasProperty(QTextFormat::FullWidthSelection)
                           && block.contains(range.cursor.position())) {
                    // for full width selections we don't require an actual selection, just
                    // a position to specify the line. that's more convenience in usage.
                    QTextLayout::FormatRange o;
                    QTextLine l = layout->lineForTextPosition(range.cursor.position() - blpos);
                    o.start = l.textStart();
                    o.length = l.textLength();
                    if (o.start + o.length == bllen - 1)
                        ++o.length; // include newline
                    o.format = range.format;
                    selections.append(o);
                }
            }

            bool drawCursor = ((editable || (textInteractionFlags() & Qt::TextSelectableByKeyboard))
                               && context.cursorPosition >= blpos
                               && context.cursorPosition < blpos + bllen);

            bool drawCursorAsBlock = drawCursor && overwriteMode() ;

            if (drawCursorAsBlock) {
                if (context.cursorPosition == blpos + bllen - 1) {
                    drawCursorAsBlock = false;
                } else {
                    QTextLayout::FormatRange o;
                    o.start = context.cursorPosition - blpos;
                    o.length = 1;
                    o.format.setForeground(palette().base());
                    o.format.setBackground(palette().text());
                    selections.append(o);
                }
            }

            layout->draw(&painter, offset, selections, er);

            if ((drawCursor && !drawCursorAsBlock)
                || (editable && context.cursorPosition < -1
                    && !layout->preeditAreaText().isEmpty())) {
                int cpos = context.cursorPosition;
                if (cpos < -1)
                    cpos = layout->preeditAreaPosition() - (cpos + 2);
                else
                    cpos -= blpos;
                layout->drawCursor(&painter, offset, cpos, cursorWidth());
            }
        }

        offset.ry() += r.height();
        if (offset.y() > viewportRect.height())
            break;
        block = block.next();
    }

    if (backgroundVisible() && !block.isValid() && offset.y() <= er.bottom()
        && (centerOnScroll() || verticalScrollBar()->maximum() == verticalScrollBar()->minimum())) {
        painter.fillRect(QRect(QPoint((int)er.left(), (int)offset.y()), er.bottomRight()), palette().window());
    }
}